

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec4 ImGui::ColorConvertU32ToFloat4(ImU32 in)

{
  uint in_EDI;
  float s;
  ImVec4 local_10;
  
  ImVec4::ImVec4(&local_10,(float)(in_EDI & 0xff) * 0.003921569,
                 (float)(in_EDI >> 8 & 0xff) * 0.003921569,
                 (float)(in_EDI >> 0x10 & 0xff) * 0.003921569,(float)(in_EDI >> 0x18) * 0.003921569)
  ;
  return local_10;
}

Assistant:

ImVec4 ImGui::ColorConvertU32ToFloat4(ImU32 in)
{
    float s = 1.0f/255.0f;
    return ImVec4(
        ((in >> IM_COL32_R_SHIFT) & 0xFF) * s,
        ((in >> IM_COL32_G_SHIFT) & 0xFF) * s,
        ((in >> IM_COL32_B_SHIFT) & 0xFF) * s,
        ((in >> IM_COL32_A_SHIFT) & 0xFF) * s);
}